

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ImportInfo *pIVar5;
  long lVar6;
  cmake *this_01;
  char *pcVar7;
  undefined1 local_1d0 [16];
  string local_1c0;
  string install_name;
  
  if (this->Target->IsImportedTarget == false) {
    if (this->Target->TargetTypeValue == SHARED_LIBRARY) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_name,"INSTALL_NAME_DIR",(allocator<char> *)(local_1d0 + 0x10));
      pcVar7 = GetProperty(this,&install_name);
      std::__cxx11::string::~string((string *)&install_name);
      bVar1 = MacOSXUseInstallNameDir(this);
      bVar4 = pcVar7 == (char *)0x0;
      if (!bVar4 && bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&install_name,pcVar7,(allocator<char> *)(local_1d0 + 0x10));
        bVar2 = std::operator==(&install_name,"@rpath");
        std::__cxx11::string::~string((string *)&install_name);
        bVar3 = false;
        bVar4 = false;
        if (bVar2) goto LAB_002eaf7c;
      }
      if ((bVar4 || !bVar1) && (bVar3 = MacOSXRpathInstallNameDirDefault(this), bVar3))
      goto LAB_002eaf7c;
    }
  }
  else {
    pIVar5 = GetImportInfo(this,config);
    if (pIVar5 != (ImportInfo *)0x0) {
      if ((pIVar5->NoSOName == false) && ((pIVar5->SOName)._M_string_length != 0)) {
        bVar3 = false;
        lVar6 = std::__cxx11::string::find((char *)&pIVar5->SOName,0x481553);
        if (lVar6 != 0) {
          return false;
        }
      }
      else {
        install_name._M_dataplus._M_p = (pointer)&install_name.field_2;
        install_name._M_string_length = 0;
        install_name.field_2._M_local_buf[0] = '\0';
        cmSystemTools::GuessLibraryInstallName(&pIVar5->Location,&install_name);
        bVar3 = false;
        lVar6 = std::__cxx11::string::find((char *)&install_name,0x47b78b);
        std::__cxx11::string::~string((string *)&install_name);
        if (lVar6 == -1) {
          return false;
        }
      }
LAB_002eaf7c:
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&install_name,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG",
                 (allocator<char> *)(local_1d0 + 0x10));
      bVar4 = cmMakefile::IsSet(this_00,&install_name);
      std::__cxx11::string::~string((string *)&install_name);
      if (bVar4) {
        return true;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&install_name);
      std::operator<<((ostream *)&install_name,"Attempting to use ");
      pcVar7 = "@rpath";
      if (bVar3 != false) {
        pcVar7 = "MACOSX_RPATH";
      }
      std::operator<<((ostream *)&install_name,pcVar7);
      std::operator<<((ostream *)&install_name,
                      " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.");
      std::operator<<((ostream *)&install_name,
                      "  This could be because you are using a Mac OS X version");
      std::operator<<((ostream *)&install_name,
                      " less than 10.5 or because CMake\'s platform configuration is");
      std::operator<<((ostream *)&install_name," corrupt.");
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      GetBacktrace((cmGeneratorTarget *)local_1d0);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)(local_1d0 + 0x10),
                          (cmListFileBacktrace *)local_1d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
      std::__cxx11::string::~string((string *)(local_1d0 + 0x10));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&install_name);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(MessageType::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}